

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

void dealloc_arrays(aom_film_grain_t *params,int ***pred_pos_luma,int ***pred_pos_chroma,
                   int **luma_grain_block,int **cb_grain_block,int **cr_grain_block,int **y_line_buf
                   ,int **cb_line_buf,int **cr_line_buf,int **y_col_buf,int **cb_col_buf,
                   int **cr_col_buf)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (params->ar_coeff_lag + 1) * params->ar_coeff_lag * 2;
  iVar1 = params->num_y_points;
  if (*pred_pos_luma != (int **)0x0) {
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      aom_free((*pred_pos_luma)[uVar4]);
    }
    aom_free(*pred_pos_luma);
    *pred_pos_luma = (int **)0x0;
  }
  if (*pred_pos_chroma != (int **)0x0) {
    uVar4 = 0;
    uVar2 = uVar2 | 0 < iVar1;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      aom_free((*pred_pos_chroma)[uVar4]);
    }
    aom_free(*pred_pos_chroma);
    *pred_pos_chroma = (int **)0x0;
  }
  aom_free(*y_line_buf);
  *y_line_buf = (int *)0x0;
  aom_free(*cb_line_buf);
  *cb_line_buf = (int *)0x0;
  aom_free(*cr_line_buf);
  *cr_line_buf = (int *)0x0;
  aom_free(*y_col_buf);
  *y_col_buf = (int *)0x0;
  aom_free(*cb_col_buf);
  *cb_col_buf = (int *)0x0;
  aom_free(*cr_col_buf);
  *cr_col_buf = (int *)0x0;
  aom_free(*luma_grain_block);
  *luma_grain_block = (int *)0x0;
  aom_free(*cb_grain_block);
  *cb_grain_block = (int *)0x0;
  aom_free(*cr_grain_block);
  *cr_grain_block = (int *)0x0;
  return;
}

Assistant:

static void dealloc_arrays(const aom_film_grain_t *params, int ***pred_pos_luma,
                           int ***pred_pos_chroma, int **luma_grain_block,
                           int **cb_grain_block, int **cr_grain_block,
                           int **y_line_buf, int **cb_line_buf,
                           int **cr_line_buf, int **y_col_buf, int **cb_col_buf,
                           int **cr_col_buf) {
  int num_pos_luma = 2 * params->ar_coeff_lag * (params->ar_coeff_lag + 1);
  int num_pos_chroma = num_pos_luma;
  if (params->num_y_points > 0) ++num_pos_chroma;

  if (*pred_pos_luma) {
    for (int row = 0; row < num_pos_luma; row++) {
      aom_free((*pred_pos_luma)[row]);
    }
    aom_free(*pred_pos_luma);
    *pred_pos_luma = NULL;
  }

  if (*pred_pos_chroma) {
    for (int row = 0; row < num_pos_chroma; row++) {
      aom_free((*pred_pos_chroma)[row]);
    }
    aom_free(*pred_pos_chroma);
    *pred_pos_chroma = NULL;
  }

  aom_free(*y_line_buf);
  *y_line_buf = NULL;

  aom_free(*cb_line_buf);
  *cb_line_buf = NULL;

  aom_free(*cr_line_buf);
  *cr_line_buf = NULL;

  aom_free(*y_col_buf);
  *y_col_buf = NULL;

  aom_free(*cb_col_buf);
  *cb_col_buf = NULL;

  aom_free(*cr_col_buf);
  *cr_col_buf = NULL;

  aom_free(*luma_grain_block);
  *luma_grain_block = NULL;

  aom_free(*cb_grain_block);
  *cb_grain_block = NULL;

  aom_free(*cr_grain_block);
  *cr_grain_block = NULL;
}